

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint readChunk_PLTE(LodePNGColorMode *color,uchar *data,size_t chunkLength)

{
  uint uVar1;
  uint local_30;
  uint local_2c;
  uint i;
  uint pos;
  size_t chunkLength_local;
  uchar *data_local;
  LodePNGColorMode *color_local;
  
  local_2c = 0;
  color->palettesize = chunkLength / 3;
  if ((color->palettesize == 0) || (0x100 < color->palettesize)) {
    color_local._4_4_ = 0x26;
  }
  else {
    lodepng_color_mode_alloc_palette(color);
    if ((color->palette == (uchar *)0x0) && (color->palettesize != 0)) {
      color->palettesize = 0;
      color_local._4_4_ = 0x53;
    }
    else {
      for (local_30 = 0; (ulong)local_30 != color->palettesize; local_30 = local_30 + 1) {
        color->palette[local_30 << 2] = data[local_2c];
        uVar1 = local_2c + 2;
        color->palette[local_30 * 4 + 1] = data[local_2c + 1];
        local_2c = local_2c + 3;
        color->palette[local_30 * 4 + 2] = data[uVar1];
        color->palette[local_30 * 4 + 3] = 0xff;
      }
      color_local._4_4_ = 0;
    }
  }
  return color_local._4_4_;
}

Assistant:

static unsigned readChunk_PLTE(LodePNGColorMode* color, const unsigned char* data, size_t chunkLength) {
  unsigned pos = 0, i;
  color->palettesize = chunkLength / 3u;
  if(color->palettesize == 0 || color->palettesize > 256) return 38; /*error: palette too small or big*/
  lodepng_color_mode_alloc_palette(color);
  if(!color->palette && color->palettesize) {
    color->palettesize = 0;
    return 83; /*alloc fail*/
  }

  for(i = 0; i != color->palettesize; ++i) {
    color->palette[4 * i + 0] = data[pos++]; /*R*/
    color->palette[4 * i + 1] = data[pos++]; /*G*/
    color->palette[4 * i + 2] = data[pos++]; /*B*/
    color->palette[4 * i + 3] = 255; /*alpha*/
  }

  return 0; /* OK */
}